

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_finalize(sqlite3_stmt *pStmt)

{
  sqlite3 *db;
  int iVar1;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    iVar1 = 0;
  }
  else {
    db = *(sqlite3 **)pStmt;
    iVar1 = vdbeSafety((Vdbe *)pStmt);
    if (iVar1 == 0) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      iVar1 = sqlite3VdbeFinalize((Vdbe *)pStmt);
      iVar1 = sqlite3ApiExit(db,iVar1);
      sqlite3LeaveMutexAndCloseZombie(db);
    }
    else {
      sqlite3MisuseError(0xf72a);
      iVar1 = 0x15;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_finalize(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    /* IMPLEMENTATION-OF: R-57228-12904 Invoking sqlite3_finalize() on a NULL
    ** pointer is a harmless no-op. */
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    if( vdbeSafety(v) ) return SQLITE_MISUSE_BKPT;
    sqlite3_mutex_enter(db->mutex);
    rc = sqlite3VdbeFinalize(v);
    rc = sqlite3ApiExit(db, rc);
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return rc;
}